

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v8::detail::dragonbox::divisible_by_power_of_2(uint32_t x,int exp)

{
  int iVar1;
  int in_ESI;
  uint in_EDI;
  bool local_a;
  bool local_9;
  int local_8;
  uint local_4;
  
  local_9 = 0 < in_ESI;
  local_8 = in_ESI;
  local_4 = in_EDI;
  ignore_unused<bool,char[1]>(&local_9,(char (*) [1])0x1bc167);
  local_a = local_4 != 0;
  ignore_unused<bool,char[1]>(&local_a,(char (*) [1])0x1bc167);
  iVar1 = 0;
  for (; (local_4 & 1) == 0; local_4 = local_4 >> 1 | 0x80000000) {
    iVar1 = iVar1 + 1;
  }
  return local_8 <= iVar1;
}

Assistant:

inline bool divisible_by_power_of_2(uint32_t x, int exp) FMT_NOEXCEPT {
  FMT_ASSERT(exp >= 1, "");
  FMT_ASSERT(x != 0, "");
#ifdef FMT_BUILTIN_CTZ
  return FMT_BUILTIN_CTZ(x) >= exp;
#else
  return exp < num_bits<uint32_t>() && x == ((x >> exp) << exp);
#endif
}